

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

uint64_t __thiscall
anon_unknown.dwarf_18bb43::hash_function::operator()(hash_function *this,string *str)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&this->map_->_M_t,str);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header) {
    return *(uint64_t *)(cVar1._M_node + 2);
  }
  pstore::assert_failed
            ("it != map_.end ()",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
             ,0x10d);
}

Assistant:

std::uint64_t operator() (std::string const & str) const {
            auto it = map_.find (str);
            PSTORE_ASSERT (it != map_.end ());
            return it->second;
        }